

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError add2list(curl_slist **list,char *ptr)

{
  curl_slist *pcVar1;
  curl_slist *newlist;
  char *ptr_local;
  curl_slist **list_local;
  
  pcVar1 = (curl_slist *)curl_slist_append(*list,ptr);
  if (pcVar1 == (curl_slist *)0x0) {
    list_local._4_4_ = PARAM_NO_MEM;
  }
  else {
    *list = pcVar1;
    list_local._4_4_ = PARAM_OK;
  }
  return list_local._4_4_;
}

Assistant:

ParameterError add2list(struct curl_slist **list, const char *ptr)
{
  struct curl_slist *newlist = curl_slist_append(*list, ptr);
  if(newlist)
    *list = newlist;
  else
    return PARAM_NO_MEM;

  return PARAM_OK;
}